

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# home.cpp
# Opt level: O2

string * fs_get_homedir_abi_cxx11_(void)

{
  _Bool _Var1;
  char *pcVar2;
  size_t sVar3;
  string *in_RDI;
  string_view name;
  string_view in;
  string home;
  
  _Var1 = fs_is_windows();
  pcVar2 = "HOME";
  if (_Var1) {
    pcVar2 = "USERPROFILE";
  }
  sVar3 = 4;
  if (_Var1) {
    sVar3 = 0xb;
  }
  name._M_str = pcVar2;
  name._M_len = sVar3;
  fs_getenv_abi_cxx11_(&home,name);
  if (home._M_string_length == 0) {
    fs_get_profile_dir_abi_cxx11_();
  }
  else {
    in._M_str = home._M_dataplus._M_p;
    in._M_len = home._M_string_length;
    fs_drop_slash_abi_cxx11_(in_RDI,in);
  }
  std::__cxx11::string::~string((string *)&home);
  return in_RDI;
}

Assistant:

std::string fs_get_homedir()
{
  // has no trailing slash
  std::string home = fs_getenv(fs_is_windows() ? "USERPROFILE" : "HOME");

  return home.empty() ? fs_get_profile_dir() : fs_drop_slash(home);
}